

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

FileDescriptor * __thiscall
google::protobuf::DescriptorPool::FindFileByName(DescriptorPool *this,string_view name)

{
  bool bVar1;
  FileDescriptor *pFVar2;
  FileDescriptor *pFVar3;
  MutexLockMaybe lock;
  DeferredValidation deferred_validation;
  MutexLockMaybe local_308;
  DeferredValidation local_300;
  
  DeferredValidation::DeferredValidation(&local_300,this);
  local_308.mu_ = this->mutex_;
  if (local_308.mu_ != (Mutex *)0x0) {
    absl::lts_20250127::Mutex::Lock(local_308.mu_);
  }
  if (this->fallback_database_ != (DescriptorDatabase *)0x0) {
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&(((this->tables_)._M_t.
               super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
               .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
              _M_head_impl)->known_bad_symbols_).
             super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&(((this->tables_)._M_t.
               super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
               .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
              _M_head_impl)->known_bad_files_).
             super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  }
  pFVar2 = Tables::FindFile((this->tables_)._M_t.
                            super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                            .
                            super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>
                            ._M_head_impl,name);
  if (pFVar2 == (FileDescriptor *)0x0) {
    if (this->underlay_ != (DescriptorPool *)0x0) {
      pFVar2 = FindFileByName(this->underlay_,name);
      if (pFVar2 != (FileDescriptor *)0x0) goto LAB_00ed86c4;
    }
    bVar1 = TryFindFileInFallbackDatabase(this,name,&local_300);
    if (bVar1) {
      pFVar3 = Tables::FindFile((this->tables_)._M_t.
                                super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                                .
                                super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>
                                ._M_head_impl,name);
    }
    else {
      pFVar3 = (FileDescriptor *)0x0;
    }
    absl::lts_20250127::MutexLockMaybe::~MutexLockMaybe(&local_308);
    bVar1 = DeferredValidation::Validate(&local_300);
    pFVar2 = (FileDescriptor *)0x0;
    if (bVar1) {
      pFVar2 = pFVar3;
    }
  }
  else {
LAB_00ed86c4:
    absl::lts_20250127::MutexLockMaybe::~MutexLockMaybe(&local_308);
  }
  DeferredValidation::~DeferredValidation(&local_300);
  return pFVar2;
}

Assistant:

const FileDescriptor* DescriptorPool::FindFileByName(
    absl::string_view name) const {
  DeferredValidation deferred_validation(this);
  const FileDescriptor* result = nullptr;
  {
    absl::MutexLockMaybe lock(mutex_);
    if (fallback_database_ != nullptr) {
      tables_->known_bad_symbols_.clear();
      tables_->known_bad_files_.clear();
    }
    result = tables_->FindFile(name);
    if (result != nullptr) return result;
    if (underlay_ != nullptr) {
      result = underlay_->FindFileByName(name);
      if (result != nullptr) return result;
    }
    if (TryFindFileInFallbackDatabase(name, deferred_validation)) {
      result = tables_->FindFile(name);
    }
  }
  if (!deferred_validation.Validate()) {
    return nullptr;
  }
  return result;
}